

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSA.h
# Opt level: O0

int __thiscall
RSA::decrypt_abi_cxx11_
          (RSA *this,EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  Conversion *this_00;
  BigInt *num_decimal_base;
  bool bVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  reference pcVar2;
  BigInt local_120;
  BigInt local_100;
  string local_e0 [32];
  undefined1 local_c0 [8];
  BigInt cipher;
  _Self local_98 [3];
  _Self local_80;
  char local_71;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_70;
  char cipher_char;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  undefined1 local_48 [8];
  set<char,_std::less<char>,_std::allocator<char>_> vocab_set;
  RSA *this_local;
  
  vocab_set._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)ctx;
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  std::set<char,std::less<char>,std::allocator<char>>::
  set<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((set<char,std::less<char>,std::allocator<char>> *)local_48,__first,__last);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_70._M_current = (char *)std::__cxx11::string::end();
  do {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff90);
    if (!bVar1) {
      this_00 = *(Conversion **)(ctx + 0x1a0);
      std::__cxx11::string::string(local_e0,(string *)(ctx + 0x48));
      Conversion::convert_to_num_base((BigInt *)local_c0,this_00,(string *)local_e0);
      std::__cxx11::string::~string(local_e0);
      num_decimal_base = *(BigInt **)(ctx + 0x1a0);
      BigInt::BigInt(&local_120,(BigInt *)(ctx + 0x140));
      BigInt::powMod(&local_100,(BigInt *)local_c0,&local_120,(BigInt *)(ctx + 0xe0));
      Conversion::convert_to_voacb_base_abi_cxx11_((Conversion *)this,num_decimal_base);
      BigInt::~BigInt(&local_100);
      BigInt::~BigInt(&local_120);
      cipher.sign = 1;
      BigInt::~BigInt((BigInt *)local_c0);
LAB_0010570b:
      std::set<char,_std::less<char>,_std::allocator<char>_>::~set
                ((set<char,_std::less<char>,_std::allocator<char>_> *)local_48);
      return (int)this;
    }
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    local_71 = *pcVar2;
    local_80._M_node =
         (_Base_ptr)
         std::set<char,_std::less<char>,_std::allocator<char>_>::find
                   ((set<char,_std::less<char>,_std::allocator<char>_> *)local_48,&local_71);
    local_98[0]._M_node =
         (_Base_ptr)
         std::set<char,_std::less<char>,_std::allocator<char>_>::end
                   ((set<char,_std::less<char>,_std::allocator<char>_> *)local_48);
    bVar1 = std::operator==(&local_80,local_98);
    if (bVar1) {
      std::__cxx11::string::operator=
                ((string *)(ctx + 0x48),
                 "Some letter in the cipher text is not contained in vocabulary");
      BigInt::operator=((BigInt *)(ctx + 0x180),0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,"",(allocator *)&cipher.field_0x1f);
      std::allocator<char>::~allocator((allocator<char> *)&cipher.field_0x1f);
      cipher.sign = 1;
      goto LAB_0010570b;
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

string RSA::decrypt() {
    set<char> vocab_set(vocabulary.begin(), vocabulary.end());

    for (auto cipher_char:cipherText)
        if (vocab_set.find(cipher_char) == vocab_set.end()) {
            cipherText = "Some letter in the cipher text is not contained in vocabulary";
            cipher_BigInt = 0;
            return "";
        }
    BigInt cipher = conversion->convert_to_num_base(cipherText);

    return conversion->convert_to_voacb_base(cipher.powMod(d, n));
}